

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O2

DWORD * __thiscall MIDIStreamer::WriteStopNotes(MIDIStreamer *this,DWORD *events)

{
  long lVar1;
  int i;
  uint uVar2;
  
  uVar2 = 0;
  for (lVar1 = 0; (int)lVar1 != 0x180; lVar1 = lVar1 + 0x18) {
    *(undefined8 *)((long)events + lVar1) = 0;
    *(uint *)((long)events + lVar1 + 8) = uVar2 | 0x7bb0;
    *(undefined8 *)((long)events + lVar1 + 0xc) = 0;
    *(uint *)((long)events + lVar1 + 0x14) = uVar2 | 0x79b0;
    uVar2 = uVar2 + 1;
  }
  return (DWORD *)((long)events + lVar1);
}

Assistant:

DWORD *MIDIStreamer::WriteStopNotes(DWORD *events)
{
	for (int i = 0; i < 16; ++i)
	{
		events[0] = 0;				// dwDeltaTime
		events[1] = 0;				// dwStreamID
		events[2] = MIDI_CTRLCHANGE | i | (123 << 8);	// All notes off
		events[3] = 0;
		events[4] = 0;
		events[5] = MIDI_CTRLCHANGE | i | (121 << 8);	// Reset controllers
		events += 6;
	}
	return events;
}